

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::ImportRule>::moveAppend
          (QGenericArrayOps<QCss::ImportRule> *this,ImportRule *b,ImportRule *e)

{
  qsizetype *pqVar1;
  ImportRule *pIVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  QString *pQVar8;
  
  if ((b != e) && (b < e)) {
    pIVar2 = (this->super_QArrayDataPointer<QCss::ImportRule>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::ImportRule>).size;
      pDVar4 = (b->href).d.d;
      (b->href).d.d = (Data *)0x0;
      pIVar2[lVar3].href.d.d = pDVar4;
      pcVar5 = (b->href).d.ptr;
      (b->href).d.ptr = (char16_t *)0x0;
      pIVar2[lVar3].href.d.ptr = pcVar5;
      qVar6 = (b->href).d.size;
      (b->href).d.size = 0;
      pIVar2[lVar3].href.d.size = qVar6;
      pDVar7 = (b->media).d.d;
      (b->media).d.d = (Data *)0x0;
      pIVar2[lVar3].media.d.d = pDVar7;
      pQVar8 = (b->media).d.ptr;
      (b->media).d.ptr = (QString *)0x0;
      pIVar2[lVar3].media.d.ptr = pQVar8;
      qVar6 = (b->media).d.size;
      (b->media).d.size = 0;
      pIVar2[lVar3].media.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::ImportRule>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }